

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::ResolveTextureSubresource
          (DeviceContextVkImpl *this,ITexture *pSrcTexture,ITexture *pDstTexture,
          ResolveTextureSubresourceAttribs *ResolveAttribs)

{
  undefined4 MipLevel;
  undefined4 uVar1;
  TextureVkImpl *Texture;
  TextureVkImpl *Texture_00;
  TextureFormatAttribs *pTVar2;
  string msg;
  MipLevelProperties local_60;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::ResolveTextureSubresource
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pSrcTexture,pDstTexture,
             ResolveAttribs);
  Texture = ClassPtrCast<Diligent::TextureVkImpl,Diligent::ITexture>(pSrcTexture);
  Texture_00 = ClassPtrCast<Diligent::TextureVkImpl,Diligent::ITexture>(pDstTexture);
  if ((Texture->super_TextureBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
      .m_Desc.Format !=
      (Texture_00->super_TextureBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
      .m_Desc.Format) {
    FormatString<char[104]>
              (&msg,(char (*) [104])
                    "Vulkan requires that source and destination textures of a resolve operation have the same format (18.6)"
              );
    DebugAssertionFailed
              ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
               "ResolveTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xd86);
    std::__cxx11::string::~string((string *)&msg);
  }
  EnsureVkCmdBuffer(this);
  TransitionOrVerifyTextureState
            (this,Texture,ResolveAttribs->SrcTextureTransitionMode,RESOURCE_STATE_RESOLVE_SOURCE,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             "Resolving multi-sampled texture (DeviceContextVkImpl::ResolveTextureSubresource)");
  TransitionOrVerifyTextureState
            (this,Texture_00,ResolveAttribs->DstTextureTransitionMode,RESOURCE_STATE_RESOLVE_DEST,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             "Resolving multi-sampled texture (DeviceContextVkImpl::ResolveTextureSubresource)");
  pTVar2 = GetTextureFormatAttribs
                     ((Texture->super_TextureBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                      .m_Desc.Format);
  if ((byte)(pTVar2->ComponentType - COMPONENT_TYPE_DEPTH) < 2) {
    FormatString<char[55]>
              (&msg,(char (*) [55])"Vulkan only allows resolve operation for color formats");
    DebugAssertionFailed
              ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
               "ResolveTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xd94);
    std::__cxx11::string::~string((string *)&msg);
  }
  MipLevel = ResolveAttribs->SrcMipLevel;
  uVar1 = ResolveAttribs->SrcSlice;
  msg._M_dataplus._M_p._0_4_ = 1;
  msg._12_8_ = 1;
  msg.field_2._4_8_ = 0;
  msg._M_dataplus._M_p._4_4_ = MipLevel;
  msg._M_string_length._0_4_ = uVar1;
  msg.field_2._12_4_ = msg._M_dataplus._M_p._0_4_;
  GetMipLevelProperties
            (&local_60,
             &(Texture->super_TextureBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
              .m_Desc,MipLevel);
  VulkanUtilities::VulkanCommandBuffer::ResolveImage
            (&this->m_CommandBuffer,(Texture->m_VulkanImage).m_VkObject,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,(Texture_00->m_VulkanImage).m_VkObject,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,1,(VkImageResolve *)&msg);
  return;
}

Assistant:

void DeviceContextVkImpl::ResolveTextureSubresource(ITexture*                               pSrcTexture,
                                                    ITexture*                               pDstTexture,
                                                    const ResolveTextureSubresourceAttribs& ResolveAttribs)
{
    TDeviceContextBase::ResolveTextureSubresource(pSrcTexture, pDstTexture, ResolveAttribs);

    TextureVkImpl*     pSrcTexVk  = ClassPtrCast<TextureVkImpl>(pSrcTexture);
    TextureVkImpl*     pDstTexVk  = ClassPtrCast<TextureVkImpl>(pDstTexture);
    const TextureDesc& SrcTexDesc = pSrcTexVk->GetDesc();
    const TextureDesc& DstTexDesc = pDstTexVk->GetDesc();

    DEV_CHECK_ERR(SrcTexDesc.Format == DstTexDesc.Format, "Vulkan requires that source and destination textures of a resolve operation "
                                                          "have the same format (18.6)");
    (void)DstTexDesc;

    EnsureVkCmdBuffer();
    // srcImageLayout must be VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL or VK_IMAGE_LAYOUT_GENERAL (18.6)
    TransitionOrVerifyTextureState(*pSrcTexVk, ResolveAttribs.SrcTextureTransitionMode, RESOURCE_STATE_RESOLVE_SOURCE, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
                                   "Resolving multi-sampled texture (DeviceContextVkImpl::ResolveTextureSubresource)");

    // dstImageLayout must be VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL or VK_IMAGE_LAYOUT_GENERAL (18.6)
    TransitionOrVerifyTextureState(*pDstTexVk, ResolveAttribs.DstTextureTransitionMode, RESOURCE_STATE_RESOLVE_DEST, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
                                   "Resolving multi-sampled texture (DeviceContextVkImpl::ResolveTextureSubresource)");

    const TextureFormatAttribs& ResolveFmtAttribs = GetTextureFormatAttribs(SrcTexDesc.Format);
    DEV_CHECK_ERR(ResolveFmtAttribs.ComponentType != COMPONENT_TYPE_DEPTH && ResolveFmtAttribs.ComponentType != COMPONENT_TYPE_DEPTH_STENCIL,
                  "Vulkan only allows resolve operation for color formats");
    (void)ResolveFmtAttribs;
    // The aspectMask member of srcSubresource and dstSubresource must only contain VK_IMAGE_ASPECT_COLOR_BIT (18.6)
    VkImageAspectFlags aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;

    VkImageResolve ResolveRegion;
    ResolveRegion.srcSubresource.baseArrayLayer = ResolveAttribs.SrcSlice;
    ResolveRegion.srcSubresource.layerCount     = 1;
    ResolveRegion.srcSubresource.mipLevel       = ResolveAttribs.SrcMipLevel;
    ResolveRegion.srcSubresource.aspectMask     = aspectMask;

    ResolveRegion.dstSubresource.baseArrayLayer = ResolveAttribs.DstSlice;
    ResolveRegion.dstSubresource.layerCount     = 1;
    ResolveRegion.dstSubresource.mipLevel       = ResolveAttribs.DstMipLevel;
    ResolveRegion.dstSubresource.aspectMask     = aspectMask;

    ResolveRegion.srcOffset              = VkOffset3D{};
    ResolveRegion.dstOffset              = VkOffset3D{};
    const MipLevelProperties& MipAttribs = GetMipLevelProperties(SrcTexDesc, ResolveAttribs.SrcMipLevel);
    ResolveRegion.extent                 = VkExtent3D{
        static_cast<uint32_t>(MipAttribs.LogicalWidth),
        static_cast<uint32_t>(MipAttribs.LogicalHeight),
        static_cast<uint32_t>(MipAttribs.Depth)};

    m_CommandBuffer.ResolveImage(pSrcTexVk->GetVkImage(), VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
                                 pDstTexVk->GetVkImage(), VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
                                 1, &ResolveRegion);
}